

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_assign.hpp
# Opt level: O1

void remora::bindings::
     matrix_assign<remora::dense_matrix_adaptor<double,remora::row_major,remora::continuous_dense_tag,remora::cpu_tag>,remora::dense_matrix_adaptor<double_const,remora::column_major,remora::continuous_dense_tag,remora::cpu_tag>>
               (long *m,long *e)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  undefined1 *puVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  int iVar15;
  ulong uVar16;
  void *pvVar17;
  void *__dest;
  bool bVar18;
  value_type blockStorage [8] [8];
  long local_290;
  long local_288;
  undefined1 local_238 [520];
  
  uVar1 = m[1];
  if (uVar1 != 0) {
    local_288 = *e;
    lVar2 = e[3];
    uVar3 = m[2];
    local_290 = 0;
    uVar9 = 0;
    uVar6 = uVar1;
    do {
      uVar5 = 8;
      if (uVar6 < 8) {
        uVar5 = uVar6;
      }
      iVar15 = (int)uVar5 + (uint)(uVar5 == 0);
      if (uVar3 != 0) {
        lVar4 = m[3];
        pvVar17 = (void *)(lVar4 * local_290 + *m);
        uVar5 = 0;
        uVar8 = uVar3;
        lVar11 = local_288;
        do {
          uVar16 = uVar3 + uVar5 * -8;
          if (7 < uVar16) {
            uVar16 = 8;
          }
          uVar12 = 8;
          if (uVar8 < 8) {
            uVar12 = uVar8;
          }
          puVar7 = local_238;
          lVar13 = 0;
          lVar10 = lVar11;
          do {
            uVar14 = 0;
            do {
              *(undefined8 *)(puVar7 + uVar14 * 8) = *(undefined8 *)(lVar10 + uVar14);
              uVar14 = uVar14 + 8;
            } while ((uint)(iVar15 * 8) != uVar14);
            lVar13 = lVar13 + 1;
            lVar10 = lVar10 + lVar2 * 8;
            puVar7 = puVar7 + 8;
          } while (lVar13 != uVar12 + (uVar12 == 0));
          uVar12 = 0;
          __dest = pvVar17;
          do {
            memcpy(__dest,local_238 + uVar12,(ulong)(((int)uVar16 + (uint)(uVar16 == 0)) * 8));
            uVar12 = uVar12 + 0x40;
            __dest = (void *)((long)__dest + lVar4 * 8);
          } while ((uint)(iVar15 * 0x40) != uVar12);
          uVar8 = uVar8 - 8;
          lVar11 = lVar11 + lVar2 * 0x40;
          pvVar17 = (void *)((long)pvVar17 + 0x40);
          bVar18 = uVar5 != uVar3 - 1 >> 3;
          uVar5 = uVar5 + 1;
        } while (bVar18);
      }
      uVar9 = uVar9 + 8;
      uVar6 = uVar6 - 8;
      local_288 = local_288 + 0x40;
      local_290 = local_290 + 0x40;
    } while (uVar9 < uVar1);
  }
  return;
}

Assistant:

void matrix_assign(
	matrix_expression<M, cpu_tag>& m,
	matrix_expression<E, cpu_tag> const& e,
	row_major, column_major,dense_tag, dense_tag
) {
	//compute blockwise and wrelem the transposed block.
	std::size_t const blockSize = 8;
	typename M::value_type blockStorage[blockSize][blockSize];

	typedef typename M::size_type size_type;
	auto e_elem = e().elements();
	
	size_type size1 = m().size1();
	size_type size2 = m().size2();
	for (size_type iblock = 0; iblock < size1; iblock += blockSize){
		for (size_type jblock = 0; jblock < size2; jblock += blockSize){
			std::size_t blockSizei = std::min(blockSize,size1-iblock);
			std::size_t blockSizej = std::min(blockSize,size2-jblock);

			//compute block values
			for (size_type j = 0; j < blockSizej; ++j){
				for (size_type i = 0; i < blockSizei; ++i){
					blockStorage[i][j] = e_elem(iblock+i,jblock+j);
				}
			}

			//copy block in a different order to m
			for (size_type i = 0; i < blockSizei; ++i){
				for (size_type j = 0; j < blockSizej; ++j){
					m()(iblock+i,jblock+j) = blockStorage[i][j];
				}
			}
		}
	}
}